

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parachute.h
# Opt level: O1

void __thiscall Parachute::Parachute(Parachute *this)

{
  Polygon::Polygon(&this->super_Polygon);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  return;
}

Assistant:

Parachute() {
    addPoint(Point<double>(75,350));
    addPoint(Point<double>(25,400));
    addPoint(Point<double>(0,200));
    addPoint(Point<double>(50,150));
    addPoint(Point<double>(200,100));
    addPoint(Point<double>(600,100));
    addPoint(Point<double>(750,150));
    addPoint(Point<double>(800,200));
    addPoint(Point<double>(775,400));
    addPoint(Point<double>(725,350));
    addPoint(Point<double>(575,300));
    addPoint(Point<double>(550,600));
    addPoint(Point<double>(525,600));
    addPoint(Point<double>(550,300));
    addPoint(Point<double>(250,300));
    addPoint(Point<double>(275,600));
    addPoint(Point<double>(250,600));
    addPoint(Point<double>(225,300));
  }